

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComments.cpp
# Opt level: O3

void __thiscall
RemoveCommentsTest_testSingleLineComments_Test::TestBody
          (RemoveCommentsTest_testSingleLineComments_Test *this)

{
  bool bVar1;
  char *szBuffer;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  szBuffer = (char *)operator_new__(0x52);
  memcpy(szBuffer,
         "int i = 0; \nif (4 == //)\n\ttrue) { // do something here \n\t// hello ... and bye //\n",
         0x52);
  Assimp::CommentRemover::RemoveLineComments("//",szBuffer,' ');
  testing::internal::CmpHelperSTREQ
            (local_20,"szTestResult","szTest2",
             "int i = 0; \nif (4 ==    \n\ttrue) {                      \n\t                       \n"
             ,szBuffer);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComments.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete__(szBuffer);
  return;
}

Assistant:

TEST(RemoveCommentsTest, testSingleLineComments)
{
    const char* szTest = "int i = 0; \n"
        "if (4 == //)\n"
        "\ttrue) { // do something here \n"
        "\t// hello ... and bye //\n";

    const size_t len( ::strlen( szTest ) + 1 );
    char* szTest2 = new char[ len ];
    ::strncpy( szTest2, szTest, len );

    const char* szTestResult = "int i = 0; \n"
        "if (4 ==    \n"
        "\ttrue) {                      \n"
        "\t                       \n";

    CommentRemover::RemoveLineComments("//",szTest2,' ');
    EXPECT_STREQ(szTestResult, szTest2);

    delete[] szTest2;
}